

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double buffon_box_pdf(double a,double b,double l)

{
  double dVar1;
  double r8_pi;
  double pdf;
  double l_local;
  double b_local;
  double a_local;
  
  if (a < 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BUFFON_BOX_PDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input A < 0.\n");
    exit(1);
  }
  if ((a != 0.0) || (NAN(a))) {
    if (b < 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"BUFFON_BOX_PDF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  Input B < 0.\n");
      exit(1);
    }
    if ((b != 0.0) || (NAN(b))) {
      if (l < 0.0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"BUFFON_BOX_PDF - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  Input L < 0.\n");
        exit(1);
      }
      if ((l != 0.0) || (NAN(l))) {
        dVar1 = r8_min(a,b);
        if (dVar1 < l) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"BUFFON_BOX_PDF - Fatal error!\n");
          std::operator<<((ostream *)&std::cerr,"  min ( A, B ) < L.\n");
          exit(1);
        }
        a_local = (l * 2.0 * (a + b) + -(l * l)) / (a * 3.141592653589793 * b);
      }
      else {
        a_local = 0.0;
      }
    }
    else {
      a_local = 1.0;
    }
  }
  else {
    a_local = 1.0;
  }
  return a_local;
}

Assistant:

double buffon_box_pdf ( double a, double b, double l )

//****************************************************************************80
//
//  Purpose:
//
//    BUFFON_BOX_PDF evaluates the Buffon Box PDF.
//
//  Discussion:
//
//    In the Buffon-Laplace needle experiment, we suppose that the plane has
//    been tiled into a grid of rectangles of width A and height B, and that a
//    needle of length L is dropped "at random" onto this grid.
//
//    We may assume that one end, the "eye" of the needle falls at the point
//    (X1,Y1), taken uniformly at random in the cell [0,A]x[0,B].
//
//    ANGLE, the angle that the needle makes is taken to be uniformly random.
//    The point of the needle, (X2,Y2), therefore lies at
//
//      (X2,Y2) = ( X1+L*cos(ANGLE), Y1+L*sin(ANGLE) )
//
//    The needle will have crossed at least one grid line if any of the
//    following are true:
//
//      X2 <= 0, A <= X2, Y2 <= 0, B <= Y2.
//
//    If L is larger than sqrt ( A*A + B*B ), then the needle will
//    cross every time, and the computation is uninteresting.  However, if
//    L is smaller than this limit, then the probability of a crossing on
//    a single trial is
//
//      P(L,A,B) = ( 2 * L * ( A + B ) - L * L ) / ( PI * A * B )
//
//    and therefore, a record of the number of hits for a given number of
//    trials can be used as a very roundabout way of estimating PI.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 February 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Sudarshan Raghunathan,
//    Making a Supercomputer Do What You Want: High Level Tools for
//    Parallel Programming,
//    Computing in Science and Engineering,
//    Volume 8, Number 5, September/October 2006, pages 70-80.
//
//  Parameters:
//
//    Input, double A, B, the horizontal and vertical dimensions
//    of each cell of the grid.  0 <= A, 0 <= B.
//
//    Input, double L, the length of the needle.
//    0 <= L <= min ( A, B ).
//
//    Output, double BUFFON_BOX_PDF, the PDF.
//
{
  double pdf;
  const double r8_pi = 3.141592653589793238462643;

  if ( a < 0.0 )
  {
    cerr << "\n";
    cerr << "BUFFON_BOX_PDF - Fatal error!\n";
    cerr << "  Input A < 0.\n";
    exit ( 1 );
  }
  else if ( a == 0.0 )
  {
    pdf = 1.0;
    return pdf;
  }

  if ( b < 0.0 )
  {
    cerr << "\n";
    cerr << "BUFFON_BOX_PDF - Fatal error!\n";
    cerr << "  Input B < 0.\n";
    exit ( 1 );
  }
  else if ( b == 0.0 )
  {
    pdf = 1.0;
    return pdf;
  }

  if ( l < 0.0 )
  {
    cerr << "\n";
    cerr << "BUFFON_BOX_PDF - Fatal error!\n";
    cerr << "  Input L < 0.\n";
    exit ( 1 );
  }
  else if ( l == 0.0 )
  {
    pdf = 0.0;
    return pdf;
  }
  else if ( r8_min ( a, b ) < l )
  {
    cerr << "\n";
    cerr << "BUFFON_BOX_PDF - Fatal error!\n";
    cerr << "  min ( A, B ) < L.\n";
    exit ( 1 );
  }

  pdf = ( 2.0 * l * ( a + b ) - l * l ) / ( r8_pi * a * b );

  return pdf;
}